

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mdpvi.cpp
# Opt level: O1

void __thiscall acasx::MDPVI::storeQValues(MDPVI *this)

{
  long lVar1;
  undefined8 uVar2;
  pointer piVar3;
  pointer piVar4;
  pointer piVar5;
  char cVar6;
  ostream *poVar7;
  long *plVar8;
  int k;
  ulong uVar9;
  MDP *this_00;
  int cStateOrder;
  int *a;
  pointer piVar10;
  bool bVar11;
  double dVar12;
  vector<int,_std::allocator<int>_> actions;
  ofstream actionFileWriter;
  ofstream costFileWriter;
  ofstream indexFileWriter;
  vector<int,_std::allocator<int>_> local_648;
  long local_630;
  filebuf local_628 [240];
  ios_base aiStack_538 [264];
  long local_430;
  filebuf local_428 [240];
  ios_base aiStack_338 [264];
  long local_230;
  filebuf local_228 [240];
  ios_base aiStack_138 [264];
  
  std::ofstream::ofstream(&local_230);
  std::ofstream::open((char *)&local_230,0x10b601);
  std::ofstream::ofstream(&local_430);
  std::ofstream::open((char *)&local_430,0x10b6b9);
  std::ofstream::ofstream(&local_630);
  std::ofstream::open((char *)&local_630,0x10b6d6);
  cVar6 = std::__basic_file<char>::is_open();
  if (((cVar6 != '\0') && (cVar6 = std::__basic_file<char>::is_open(), cVar6 != '\0')) &&
     (cVar6 = std::__basic_file<char>::is_open(), cVar6 != '\0')) {
    if (this->mdp->numCStates < 1) {
      uVar9 = 0;
    }
    else {
      uVar9 = 0;
      do {
        poVar7 = (ostream *)std::ostream::operator<<((ostream *)&local_230,(int)uVar9);
        std::__ostream_insert<char,std::char_traits<char>>(poVar7,"\n",1);
        poVar7 = (ostream *)std::ostream::operator<<((ostream *)&local_630,0);
        std::__ostream_insert<char,std::char_traits<char>>(poVar7,"\n",1);
        poVar7 = std::ostream::_M_insert<double>((*this->U)[uVar9]);
        std::__ostream_insert<char,std::char_traits<char>>(poVar7,"\n",1);
        uVar9 = uVar9 + 1;
      } while ((long)uVar9 < (long)this->mdp->numCStates);
    }
    k = 1;
    do {
      this_00 = this->mdp;
      if (0 < this_00->numCStates) {
        cStateOrder = 0;
        do {
          MDP::actions(&local_648,this_00,cStateOrder);
          poVar7 = (ostream *)std::ostream::operator<<((ostream *)&local_230,(int)uVar9);
          std::__ostream_insert<char,std::char_traits<char>>(poVar7,"\n",1);
          piVar4 = local_648.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                   super__Vector_impl_data._M_finish;
          for (piVar10 = local_648.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                         super__Vector_impl_data._M_start;
              piVar5 = local_648.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                       super__Vector_impl_data._M_finish,
              piVar3 = local_648.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                       super__Vector_impl_data._M_start, piVar10 != piVar4; piVar10 = piVar10 + 1) {
            poVar7 = (ostream *)std::ostream::operator<<((ostream *)&local_630,*piVar10);
            std::__ostream_insert<char,std::char_traits<char>>(poVar7,"\n",1);
            dVar12 = getQValue(this,k,cStateOrder,*piVar10);
            poVar7 = std::ostream::_M_insert<double>(dVar12);
            std::__ostream_insert<char,std::char_traits<char>>(poVar7,"\n",1);
          }
          if (local_648.super__Vector_base<int,_std::allocator<int>_>._M_impl.
              super__Vector_impl_data._M_start != (int *)0x0) {
            operator_delete(local_648.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                            super__Vector_impl_data._M_start);
          }
          uVar9 = (ulong)(uint)((int)uVar9 + (int)((ulong)((long)piVar5 - (long)piVar3) >> 2));
          cStateOrder = cStateOrder + 1;
          this_00 = this->mdp;
        } while (cStateOrder < this_00->numCStates);
      }
      bVar11 = k != 0x15;
      k = k + 1;
    } while (bVar11);
    plVar8 = (long *)std::ostream::operator<<((ostream *)&local_230,(int)uVar9);
    std::ios::widen((char)*(undefined8 *)(*plVar8 + -0x18) + (char)plVar8);
    std::ostream::put((char)plVar8);
    std::ostream::flush();
    std::ios::widen((char)&local_630 + (char)*(undefined8 *)(local_630 + -0x18));
    std::ostream::put((char)&local_630);
    std::ostream::flush();
    std::ios::widen((char)&local_430 + (char)*(undefined8 *)(local_430 + -0x18));
    std::ostream::put((char)&local_430);
    std::ostream::flush();
    std::ofstream::close();
    std::ofstream::close();
    std::ofstream::close();
    uVar2 = _memcpy;
    lVar1 = _VTT;
    local_630 = _VTT;
    *(undefined8 *)(local_628 + *(long *)(_VTT + -0x18) + -8) = _memcpy;
    std::filebuf::~filebuf(local_628);
    std::ios_base::~ios_base(aiStack_538);
    local_430 = lVar1;
    *(undefined8 *)(local_428 + *(long *)(lVar1 + -0x18) + -8) = uVar2;
    std::filebuf::~filebuf(local_428);
    std::ios_base::~ios_base(aiStack_338);
    local_230 = lVar1;
    *(undefined8 *)(local_228 + *(long *)(lVar1 + -0x18) + -8) = uVar2;
    std::filebuf::~filebuf(local_228);
    std::ios_base::~ios_base(aiStack_138);
    return;
  }
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cerr,"failure in opening files",0x18);
  std::endl<char,std::char_traits<char>>((ostream *)&std::cerr);
  abort();
}

Assistant:

void MDPVI::storeQValues()
{
    ofstream indexFileWriter;
    indexFileWriter.open("indexFile", ios_base::out|ios_base::trunc);
    ofstream costFileWriter;
    costFileWriter.open("costFile", ios_base::out|ios_base::trunc);
    ofstream actionFileWriter;
    actionFileWriter.open("actionFile", ios_base::out|ios_base::trunc);

    if(!indexFileWriter.is_open() || !costFileWriter.is_open() || !actionFileWriter.is_open())
    {
        cerr<<"failure in opening files"<<endl;
        abort();
    }

    int index=0;
    for (int i=0; i<mdp->getCStatesNum(); ++i)//T=k=0
    {
        indexFileWriter<<index<<"\n";
        actionFileWriter<<0<<"\n";  //leaving states, using O to avoid arrayIndexOutofRange problem
        index++;
        costFileWriter<<U[0][i]<<"\n";
    }

    for(int k=1; k<=TIME_HORIZON+1; ++k )
    {
        for (int i=0; i<mdp->getCStatesNum();++i)
        {
            vector<int> actions=mdp->actions(i);
            indexFileWriter<<index<<"\n";
            for (int& a :actions )
            {
                actionFileWriter<<a<<"\n";
                double QValue = getQValue(k, i, a);
                costFileWriter<<QValue<<"\n";
            }
            index+=actions.size();
        }
    }

    indexFileWriter<<index<<endl;
    actionFileWriter<<endl;
    costFileWriter<<endl;

    indexFileWriter.close();
    costFileWriter.close();
    actionFileWriter.close();

}